

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

void __thiscall
tonk::Connection::OnNATProbe
          (Connection *this,UDPAddress *addr,uint32_t key,ConnectionAddrMap *addrMap,
          IUDPSender *sender)

{
  type *in_RCX;
  basic_endpoint<asio::ip::udp> *in_RDI;
  strand *in_R8;
  basic_endpoint<asio::ip::udp> *in_stack_ffffffffffffff88;
  
  std::unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>::
  operator->((unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_> *
             )0x1a55b2);
  asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint(in_RDI,in_stack_ffffffffffffff88);
  asio::io_context::strand::
  post<tonk::Connection::OnNATProbe(asio::ip::basic_endpoint<asio::ip::udp>const&,unsigned_int,tonk::ConnectionAddrMap*,tonk::IUDPSender*)::__0>
            (in_R8,in_RCX);
  return;
}

Assistant:

void Connection::OnNATProbe(
    const UDPAddress& addr,
    uint32_t key,
    ConnectionAddrMap* addrMap,
    IUDPSender* sender)
{
    AsioEventStrand->post([this, addr, key, addrMap, sender]()
    {
        TONK_DEBUG_ASSERT(AsioEventStrand->running_in_this_thread());

        if (!HolePuncher) {
            Logger.Warning("Ignoring NAT probe from unrelated port");
        }
        else if (!HolePuncher->SeenProbe)
        {
            HolePuncher->SeenProbe = true;

            Logger.Warning("NAT probe from ", addr.address().to_string(), " : ", addr.port(), " - key = ", HexString(key));

            // Start attaching handshake to each outgoing datagram
            Outgoing.StartHandshakePeer2PeerConnect(HolePuncher->StartParams.GetOutgoingHandshakeKey());

            // Update source and destination addresses
            setPeerAddressAndSource(addrMap, sender, addr);
        }
        else {
            Logger.Warning("Ignoring extra probe from ", addr.address().to_string(), " : ", addr.port(), " - key = ", HexString(key));
        }

        SelfRefCount.DecrementReferences();
    });
}